

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy_encode.c
# Opt level: O1

void BrotliOptimizeHuffmanCountsForRle(size_t length,uint32_t *counts,uint8_t *good_for_rle)

{
  uint uVar1;
  uint uVar2;
  size_t sVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  uint32_t uVar7;
  ulong uVar8;
  ulong uVar9;
  size_t __n;
  uint32_t *puVar10;
  bool bVar11;
  
  if (length != 0) {
    sVar3 = 0;
    uVar5 = 0;
    do {
      uVar5 = (uVar5 + 1) - (ulong)(counts[sVar3] == 0);
      sVar3 = sVar3 + 1;
    } while (length != sVar3);
    if (0xf < uVar5) {
      puVar10 = counts + -1;
      do {
        if (puVar10[length] != 0) {
          uVar2 = 0x40000000;
          uVar8 = 0;
          uVar5 = 0;
          do {
            uVar9 = uVar5;
            uVar1 = counts[uVar8];
            uVar4 = uVar1;
            if (uVar2 < uVar1) {
              uVar4 = uVar2;
            }
            if (uVar1 == 0) {
              uVar4 = uVar2;
            }
            uVar2 = uVar4;
            uVar5 = (uVar1 != 0) + uVar9;
            uVar8 = uVar8 + 1;
          } while (uVar8 < length);
          if (uVar5 < 5) {
            return;
          }
          if (((uVar2 < 4) && (((length - 1) + (ulong)(uVar1 == 0)) - uVar9 < 6)) &&
             (1 < length - 1)) {
            uVar8 = 1;
            do {
              if (((counts[uVar8 - 1] != 0) && (counts[uVar8] == 0)) && (counts[uVar8 + 1] != 0)) {
                counts[uVar8] = 1;
              }
              uVar8 = uVar8 + 1;
            } while (uVar8 < length - 1);
          }
          if (uVar5 < 0x1c) {
            return;
          }
          uVar8 = 0;
          memset(good_for_rle,0,length);
          uVar7 = *counts;
          uVar5 = 0;
          do {
            if ((length == uVar5) || (counts[uVar5] != uVar7)) {
              if ((uVar7 == 0 && 4 < uVar8) || (6 < uVar8 && uVar7 != 0)) {
                __n = uVar8 + (uVar8 == 0);
                memset(good_for_rle + (uVar5 - __n),1,__n);
              }
              uVar8 = 1;
              if (length != uVar5) {
                uVar7 = counts[uVar5];
              }
            }
            else {
              uVar8 = uVar8 + 1;
            }
            bVar11 = uVar5 < length;
            uVar5 = uVar5 + 1;
          } while (bVar11);
          uVar5 = (ulong)(((counts[1] + *counts + counts[2]) * 0x100) / 3 + 0x1a4);
          lVar6 = 0;
          uVar9 = 0;
          uVar8 = 0;
          do {
            if (((length == uVar8) || (good_for_rle[uVar8] != '\0')) ||
               (((uVar8 != 0 && (good_for_rle[uVar8 - 1] != '\0')) ||
                (((counts[uVar8] << 8) - uVar5) - 0x4d8 < 0xfffffffffffff650)))) {
              if ((3 < uVar9) || ((uVar9 == 3 && (lVar6 == 0)))) {
                uVar5 = (uVar9 >> 1) + lVar6;
                uVar7 = (uint32_t)(uVar5 / uVar9);
                if (uVar5 < uVar9) {
                  uVar7 = 1;
                }
                if (lVar6 == 0) {
                  uVar7 = 0;
                }
                lVar6 = 0;
                do {
                  puVar10[lVar6] = uVar7;
                  lVar6 = lVar6 + -1;
                } while (-(ulong)(uVar9 == 0) - uVar9 != lVar6);
              }
              if (uVar8 < length - 2) {
                uVar2 = ((counts[uVar8 + 1] + counts[uVar8] + counts[uVar8 + 2]) * 0x100) / 3 +
                        0x1a4;
LAB_00133506:
                uVar5 = (ulong)uVar2;
              }
              else {
                if (uVar8 < length) {
                  uVar2 = counts[uVar8] << 8;
                  goto LAB_00133506;
                }
                uVar5 = 0;
              }
              uVar9 = 0;
              lVar6 = 0;
            }
            uVar9 = uVar9 + 1;
            if (length != uVar8) {
              lVar6 = lVar6 + (ulong)counts[uVar8];
              if (3 < uVar9) {
                uVar5 = ((uVar9 >> 1) + lVar6 * 0x100) / uVar9;
              }
              if (uVar9 == 4) {
                uVar5 = uVar5 + 0x78;
              }
            }
            puVar10 = puVar10 + 1;
            bVar11 = length <= uVar8;
            uVar8 = uVar8 + 1;
            if (bVar11) {
              return;
            }
          } while( true );
        }
        length = length - 1;
      } while (length != 0);
    }
  }
  return;
}

Assistant:

void BrotliOptimizeHuffmanCountsForRle(size_t length, uint32_t* counts,
                                       uint8_t* good_for_rle) {
  size_t nonzero_count = 0;
  size_t stride;
  size_t limit;
  size_t sum;
  const size_t streak_limit = 1240;
  /* Let's make the Huffman code more compatible with RLE encoding. */
  size_t i;
  for (i = 0; i < length; i++) {
    if (counts[i]) {
      ++nonzero_count;
    }
  }
  if (nonzero_count < 16) {
    return;
  }
  while (length != 0 && counts[length - 1] == 0) {
    --length;
  }
  if (length == 0) {
    return;  /* All zeros. */
  }
  /* Now counts[0..length - 1] does not have trailing zeros. */
  {
    size_t nonzeros = 0;
    uint32_t smallest_nonzero = 1 << 30;
    for (i = 0; i < length; ++i) {
      if (counts[i] != 0) {
        ++nonzeros;
        if (smallest_nonzero > counts[i]) {
          smallest_nonzero = counts[i];
        }
      }
    }
    if (nonzeros < 5) {
      /* Small histogram will model it well. */
      return;
    }
    if (smallest_nonzero < 4) {
      size_t zeros = length - nonzeros;
      if (zeros < 6) {
        for (i = 1; i < length - 1; ++i) {
          if (counts[i - 1] != 0 && counts[i] == 0 && counts[i + 1] != 0) {
            counts[i] = 1;
          }
        }
      }
    }
    if (nonzeros < 28) {
      return;
    }
  }
  /* 2) Let's mark all population counts that already can be encoded
     with an RLE code. */
  memset(good_for_rle, 0, length);
  {
    /* Let's not spoil any of the existing good RLE codes.
       Mark any seq of 0's that is longer as 5 as a good_for_rle.
       Mark any seq of non-0's that is longer as 7 as a good_for_rle. */
    uint32_t symbol = counts[0];
    size_t step = 0;
    for (i = 0; i <= length; ++i) {
      if (i == length || counts[i] != symbol) {
        if ((symbol == 0 && step >= 5) ||
            (symbol != 0 && step >= 7)) {
          size_t k;
          for (k = 0; k < step; ++k) {
            good_for_rle[i - k - 1] = 1;
          }
        }
        step = 1;
        if (i != length) {
          symbol = counts[i];
        }
      } else {
        ++step;
      }
    }
  }
  /* 3) Let's replace those population counts that lead to more RLE codes.
     Math here is in 24.8 fixed point representation. */
  stride = 0;
  limit = 256 * (counts[0] + counts[1] + counts[2]) / 3 + 420;
  sum = 0;
  for (i = 0; i <= length; ++i) {
    if (i == length || good_for_rle[i] ||
        (i != 0 && good_for_rle[i - 1]) ||
        (256 * counts[i] - limit + streak_limit) >= 2 * streak_limit) {
      if (stride >= 4 || (stride >= 3 && sum == 0)) {
        size_t k;
        /* The stride must end, collapse what we have, if we have enough (4). */
        size_t count = (sum + stride / 2) / stride;
        if (count == 0) {
          count = 1;
        }
        if (sum == 0) {
          /* Don't make an all zeros stride to be upgraded to ones. */
          count = 0;
        }
        for (k = 0; k < stride; ++k) {
          /* We don't want to change value at counts[i],
             that is already belonging to the next stride. Thus - 1. */
          counts[i - k - 1] = (uint32_t)count;
        }
      }
      stride = 0;
      sum = 0;
      if (i < length - 2) {
        /* All interesting strides have a count of at least 4, */
        /* at least when non-zeros. */
        limit = 256 * (counts[i] + counts[i + 1] + counts[i + 2]) / 3 + 420;
      } else if (i < length) {
        limit = 256 * counts[i];
      } else {
        limit = 0;
      }
    }
    ++stride;
    if (i != length) {
      sum += counts[i];
      if (stride >= 4) {
        limit = (256 * sum + stride / 2) / stride;
      }
      if (stride == 4) {
        limit += 120;
      }
    }
  }
}